

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_Test2DTileYResourceMips_Test::TestBody
          (CTestResource_Test2DTileYResourceMips_Test *this)

{
  bool bVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint ExpectedValue;
  GMM_RESOURCE_INFO *pGVar6;
  char *pcVar7;
  AssertHelper local_a88;
  Message local_a80;
  uint local_a74;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_35;
  Message local_a58;
  uint local_a4c;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_34;
  Message local_a30;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_33;
  uint32_t Mip1Width;
  Message local_a08;
  undefined4 local_9fc;
  undefined1 local_9f8 [8];
  AssertionResult gtest_ar_32;
  AssertHelper local_988;
  Message local_980;
  uint local_974;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_31;
  Message local_958;
  uint local_94c;
  undefined1 local_948 [8];
  AssertionResult gtest_ar_30;
  Message local_930;
  uint local_924;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_29;
  Message local_908;
  undefined4 local_8fc;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_888;
  Message local_880;
  uint local_874;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_27;
  Message local_858;
  uint local_84c;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_26;
  Message local_830;
  uint local_824;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_25;
  Message local_808;
  undefined4 local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_24;
  GMM_REQ_OFFSET_INFO OffsetInfo_1;
  uint32_t Pitch_1;
  uint32_t VAlign;
  uint32_t HAlign;
  GMM_RESOURCE_INFO *ResourceInfo_1;
  GMM_RESCREATE_PARAMS gmmParams_1;
  TEST_BPP bpp_1;
  uint32_t MaxLod_1;
  uint32_t ResourceHeight_1;
  uint32_t ResourceWidth_1;
  uint32_t i_3;
  Message local_6c8;
  uint local_6bc;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_23;
  Message local_6a0;
  uint local_694;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_22;
  Message local_678;
  uint local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_21;
  Message local_650;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_5d8;
  Message local_5d0;
  uint local_5c4;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_19;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_18;
  Message local_588;
  uint local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_17;
  Message local_560;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_16;
  int local_4e8;
  uint local_4e4;
  int i_2;
  uint32_t HeightOfPrevMipsInTile;
  Message local_4d8;
  uint local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_15;
  Message local_4b0;
  uint local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_14;
  Message local_488;
  uint local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_13;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_12;
  int local_3dc;
  int i_1;
  Message local_3d0;
  uint local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_11;
  Message local_3a8;
  uint local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_10;
  Message local_380;
  uint local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_9;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  uint32_t MipOffset;
  AssertHelper local_2d8;
  Message local_2d0;
  uint local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_7;
  Message local_2a8;
  uint local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_6;
  Message local_280;
  uint local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_5;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_4;
  uint32_t HeightOfPrevMip;
  uint32_t SizeOfMip0;
  AssertHelper local_1d8;
  Message local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  uint local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180;
  uint local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158 [3];
  undefined4 local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint32_t AllocationHeight;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  TEST_BPP bpp;
  uint32_t MaxLod;
  uint32_t ResourceHeight;
  uint32_t ResourceWidth;
  uint32_t i;
  uint32_t TileSize [2];
  CTestResource_Test2DTileYResourceMips_Test *this_local;
  
  for (ResourceHeight = 0; ResourceHeight < 5; ResourceHeight = ResourceHeight + 1) {
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.pExistingSysMem = 0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    ResourceInfo = (GMM_RESOURCE_INFO *)0x2;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x200;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x200;
    gmmParams.BaseHeight = 9;
    gmmParams.Depth = 0;
    GVar2 = CTestResource::SetResourceFormat(&this->super_CTestResource,ResourceHeight);
    ResourceInfo = (GMM_RESOURCE_INFO *)CONCAT44(GVar2,ResourceInfo._0_4_);
    pGVar6 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&ResourceInfo);
    uVar3 = CTestResource::GetBppValue(&this->super_CTestResource,ResourceHeight);
    OffsetInfo.StdLayout.TileDepthPitch._4_4_ = uVar3 << 9;
    OffsetInfo.StdLayout.TileDepthPitch._0_4_ = 0;
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo.Render.field_0.Offset = 0;
    OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset = 0;
    OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar.message_.ptr_._4_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    gtest_ar.message_.ptr_._0_4_ = 1;
    OffsetInfo._0_4_ = 0;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
    local_13c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_138,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_13c
               ,&OffsetInfo.Lock.Pitch);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(local_158);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x406,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    local_174 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_170,"0",(int *)"OffsetInfo.Render.XOffset",&local_174,
               &OffsetInfo.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x407,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    local_19c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_198,"0",(int *)"OffsetInfo.Render.YOffset",&local_19c,
               (type *)((long)&OffsetInfo.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x408,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_1a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    local_1c4 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_1c0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_1c4,
               &OffsetInfo.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x409,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message(&local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo.Render.field_0.Offset = 0;
    OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset = 0;
    OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar.message_.ptr_._4_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    gtest_ar.message_.ptr_._0_4_ = 1;
    OffsetInfo._0_4_ = 1;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
    gtest_ar_4.message_.ptr_._4_4_ = OffsetInfo.StdLayout.TileDepthPitch._4_4_ << 9;
    OffsetInfo.StdLayout.TileDepthPitch._0_4_ = 0x200;
    gtest_ar_4.message_.ptr_._0_4_ = 0x200;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_250,"SizeOfMip0","OffsetInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_4.message_.ptr_ + 4),(unsigned_long *)&OffsetInfo.Lock.Pitch
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x412,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    local_274 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_270,"0",(int *)"OffsetInfo.Render.XOffset",&local_274,
               &OffsetInfo.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x413,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    local_29c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_298,"0",(int *)"OffsetInfo.Render.YOffset",&local_29c,
               (type *)((long)&OffsetInfo.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x414,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_2a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    local_2c4 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_2c0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_2c4,
               &OffsetInfo.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x415,pcVar7);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message(&local_2d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo.Render.field_0.Offset = 0;
    OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset = 0;
    OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar.message_.ptr_._4_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    gtest_ar.message_.ptr_._0_4_ = 1;
    OffsetInfo._0_4_ = 2;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
    gtest_ar_8.message_.ptr_._4_4_ =
         gtest_ar_4.message_.ptr_._4_4_ +
         (OffsetInfo.StdLayout.TileDepthPitch._4_4_ / 0x100) * 0x1000;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_350,"MipOffset","OffsetInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_8.message_.ptr_ + 4),(unsigned_long *)&OffsetInfo.Lock.Pitch
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_358);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
    local_374 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_370,"0",(int *)"OffsetInfo.Render.XOffset",&local_374,
               &OffsetInfo.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar1) {
      testing::Message::Message(&local_380);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41f,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_380);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_380);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    local_39c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_398,"0",(int *)"OffsetInfo.Render.YOffset",&local_39c,
               (type *)((long)&OffsetInfo.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x420,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
    local_3c4 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_3c0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_3c4,
               &OffsetInfo.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3d0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x421,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc28,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
      testing::Message::~Message(&local_3d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    for (local_3dc = 3; local_3dc < 6; local_3dc = local_3dc + 1) {
      gtest_ar_12.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
      OffsetInfo.Render.field_0.Offset = 0;
      OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset = 0;
      OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
      OffsetInfo.MipLevel = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      gtest_ar.message_.ptr_._4_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      gtest_ar.message_.ptr_._0_4_ = 1;
      OffsetInfo._0_4_ = local_3dc;
      (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
      gtest_ar_4.message_.ptr_._0_4_ = 0x200 >> ((char)local_3dc - 1U & 0x1f);
      OffsetInfo.StdLayout.TileDepthPitch._0_4_ =
           (int)OffsetInfo.StdLayout.TileDepthPitch + (uint)gtest_ar_4.message_.ptr_;
      gtest_ar_8.message_.ptr_._4_4_ =
           gtest_ar_8.message_.ptr_._4_4_ +
           OffsetInfo.StdLayout.TileDepthPitch._4_4_ * (uint)gtest_ar_4.message_.ptr_;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_458,"MipOffset","OffsetInfo.Render.Offset64",
                 (uint *)((long)&gtest_ar_8.message_.ptr_ + 4),
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
      if (!bVar1) {
        testing::Message::Message(&local_460);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x42e,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_460)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_460);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
      local_47c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_478,"0",(int *)"OffsetInfo.Render.XOffset",&local_47c,
                 &OffsetInfo.Render);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x430,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_488)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
        testing::Message::~Message(&local_488);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
      local_4a4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_4a0,"0",(int *)"OffsetInfo.Render.YOffset",&local_4a4,
                 (type *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
      if (!bVar1) {
        testing::Message::Message(&local_4b0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x431,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4b0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
        testing::Message::~Message(&local_4b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
      local_4cc = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_4c8,"0",(int *)"OffsetInfo.Render.ZOffset",&local_4cc,
                 &OffsetInfo.Render.XOffset);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
      if (!bVar1) {
        testing::Message::Message(&local_4d8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x432,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_4d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
        testing::Message::~Message(&local_4d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
    }
    OffsetInfo.StdLayout.TileDepthPitch._0_4_ = (int)OffsetInfo.StdLayout.TileDepthPitch + 0x20;
    local_4e4 = 0;
    for (local_4e8 = 6; local_4e8 < 9; local_4e8 = local_4e8 + 1) {
      gtest_ar_16.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
      OffsetInfo.Render.field_0.Offset = 0;
      OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset = 0;
      OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
      OffsetInfo.MipLevel = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      gtest_ar.message_.ptr_._4_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      gtest_ar.message_.ptr_._0_4_ = 1;
      OffsetInfo._0_4_ = local_4e8;
      (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_558,"MipOffset","OffsetInfo.Render.Offset64",
                 (uint *)((long)&gtest_ar_8.message_.ptr_ + 4),
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
      if (!bVar1) {
        testing::Message::Message(&local_560);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x43f,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_560)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
        testing::Message::~Message(&local_560);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
      local_57c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_578,"0",(int *)"OffsetInfo.Render.XOffset",&local_57c,
                 &OffsetInfo.Render);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
      if (!bVar1) {
        testing::Message::Message(&local_588);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x442,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_588)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
        testing::Message::~Message(&local_588);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
      local_4e4 = local_4e4 + (0x200U >> ((char)local_4e8 - 1U & 0x1f));
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_5a0,"HeightOfPrevMipsInTile","OffsetInfo.Render.YOffset",
                 &local_4e4,(uint *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
      if (!bVar1) {
        testing::Message::Message(&local_5a8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x444,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_5a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
        testing::Message::~Message(&local_5a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
      local_5c4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_5c0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_5c4,
                 &OffsetInfo.Render.XOffset);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
      if (!bVar1) {
        testing::Message::Message(&local_5d0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_5d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x445,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
        testing::internal::AssertHelper::~AssertHelper(&local_5d8);
        testing::Message::~Message(&local_5d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
    }
    gtest_ar_20.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo.Render.field_0.Offset = 0;
    OffsetInfo.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset = 0;
    OffsetInfo.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar.message_.ptr_._4_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    gtest_ar.message_.ptr_._0_4_ = 1;
    OffsetInfo._0_4_ = 9;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
    gtest_ar_8.message_.ptr_._4_4_ =
         gtest_ar_8.message_.ptr_._4_4_ + OffsetInfo.StdLayout.TileDepthPitch._4_4_ * 0x20;
    OffsetInfo.StdLayout.TileDepthPitch._0_4_ = (int)OffsetInfo.StdLayout.TileDepthPitch + 0x20;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_648,"MipOffset","OffsetInfo.Render.Offset64",
               (uint *)((long)&gtest_ar_8.message_.ptr_ + 4),(unsigned_long *)&OffsetInfo.Lock.Pitch
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar1) {
      testing::Message::Message(&local_650);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x450,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_650);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_650);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    local_66c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_668,"0",(int *)"OffsetInfo.Render.XOffset",&local_66c,
               &OffsetInfo.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
    if (!bVar1) {
      testing::Message::Message(&local_678);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x451,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_678);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
      testing::Message::~Message(&local_678);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
    local_694 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_690,"0",(int *)"OffsetInfo.Render.YOffset",&local_694,
               (type *)((long)&OffsetInfo.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
    if (!bVar1) {
      testing::Message::Message(&local_6a0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x452,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_6a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
      testing::Message::~Message(&local_6a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
    local_6bc = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_6b8,"0",(int *)"OffsetInfo.Render.ZOffset",&local_6bc,
               &OffsetInfo.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
    if (!bVar1) {
      testing::Message::Message(&local_6c8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ResourceWidth_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x453,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ResourceWidth_1,&local_6c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ResourceWidth_1);
      testing::Message::~Message(&local_6c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar6,
               (ulong)((int)OffsetInfo.StdLayout.TileDepthPitch *
                      OffsetInfo.StdLayout.TileDepthPitch._4_4_));
    CTestResource::VerifyResourcePitch<true>
              (&this->super_CTestResource,pGVar6,OffsetInfo.StdLayout.TileDepthPitch._4_4_);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this->super_CTestResource,pGVar6,OffsetInfo.StdLayout.TileDepthPitch._4_4_ / 0x80);
    CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,pGVar6,0);
    CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,pGVar6,0);
    CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,pGVar6,0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
  }
  for (ResourceHeight_1 = 0; ResourceHeight_1 < 3; ResourceHeight_1 = ResourceHeight_1 + 1) {
    gmmParams_1.MultiTileArch.Reserved = ResourceHeight_1;
    gmmParams_1.MaximumRenamingListLength = 0;
    gmmParams_1.NoGfxMemory = '\0';
    gmmParams_1._109_3_ = 0;
    gmmParams_1.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams_1.pExistingSysMem = 0;
    gmmParams_1.BaseAlignment = 0;
    gmmParams_1.OverridePitch = 0;
    gmmParams_1.RotateInfo = 0;
    gmmParams_1._84_4_ = 0;
    gmmParams_1.MaxLod = 0;
    gmmParams_1.ArraySize = 0;
    gmmParams_1.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams_1.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams_1.MSAA.NumSamples = 0;
    gmmParams_1.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams_1.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    ResourceInfo_1 = (GMM_RESOURCE_INFO *)0x2;
    gmmParams_1.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
    gmmParams_1.ExistingSysMemSize = 0x100000000;
    gmmParams_1.Type = RESOURCE_INVALID;
    gmmParams_1.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams_1.CpTag = 4;
    gmmParams_1._44_4_ = 0;
    gmmParams_1.field_6.BaseWidth64 = 2;
    gmmParams_1.BaseHeight = 2;
    gmmParams_1.Depth = 0;
    GVar2 = CTestResource::SetResourceFormat(&this->super_CTestResource,ResourceHeight_1);
    ResourceInfo_1 = (GMM_RESOURCE_INFO *)CONCAT44(GVar2,ResourceInfo_1._0_4_);
    pGVar6 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&ResourceInfo_1);
    uVar4 = (**(code **)(*(long *)pGVar6 + 0x228))();
    iVar5 = (**(code **)(*(long *)pGVar6 + 0x230))();
    uVar3 = CTestResource::GetBppValue
                      (&this->super_CTestResource,gmmParams_1.MultiTileArch.Reserved);
    ExpectedValue = uVar3 * ((uVar4 + 1 & -uVar4) + (uVar4 & -uVar4)) + 0x7f & 0xffffff80;
    OffsetInfo_1.StdLayout.Offset = 0;
    OffsetInfo_1.StdLayout.TileRowPitch = 0;
    OffsetInfo_1.Render.XOffset = 0;
    OffsetInfo_1.Render.YOffset = 0;
    OffsetInfo_1.Render.ZOffset = 0;
    OffsetInfo_1.Render._20_4_ = 0;
    OffsetInfo_1.Lock.Pitch = 0;
    OffsetInfo_1.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo_1.Render.field_0.Offset = 0;
    OffsetInfo_1.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
    OffsetInfo_1._28_4_ = 0;
    OffsetInfo_1.Lock.field_0.Offset = 0;
    OffsetInfo_1.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.MipLevel = 0;
    OffsetInfo_1.Slice = 0;
    OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo_1.Plane = GMM_NO_PLANE;
    gtest_ar_24.message_.ptr_._4_4_ = 0;
    OffsetInfo_1.ArrayIndex = 0;
    gtest_ar_24.message_.ptr_._0_4_ = 1;
    OffsetInfo_1._0_4_ = 0;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar_24.message_);
    local_7fc = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_7f8,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_7fc
               ,&OffsetInfo_1.Lock.Pitch);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
    if (!bVar1) {
      testing::Message::Message(&local_808);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x486,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_808);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
      testing::Message::~Message(&local_808);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
    local_824 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_820,"0",(int *)"OffsetInfo.Render.XOffset",&local_824,
               &OffsetInfo_1.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
    if (!bVar1) {
      testing::Message::Message(&local_830);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x487,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_830);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
      testing::Message::~Message(&local_830);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
    local_84c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_848,"0",(int *)"OffsetInfo.Render.YOffset",&local_84c,
               (type *)((long)&OffsetInfo_1.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
    if (!bVar1) {
      testing::Message::Message(&local_858);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x488,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_858);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
      testing::Message::~Message(&local_858);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
    local_874 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_870,"0",(int *)"OffsetInfo.Render.ZOffset",&local_874,
               &OffsetInfo_1.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
    if (!bVar1) {
      testing::Message::Message(&local_880);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
      testing::internal::AssertHelper::AssertHelper
                (&local_888,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x489,pcVar7);
      testing::internal::AssertHelper::operator=(&local_888,&local_880);
      testing::internal::AssertHelper::~AssertHelper(&local_888);
      testing::Message::~Message(&local_880);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
    gtest_ar_28.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OffsetInfo_1.StdLayout.Offset = 0;
    OffsetInfo_1.StdLayout.TileRowPitch = 0;
    OffsetInfo_1.Render.XOffset = 0;
    OffsetInfo_1.Render.YOffset = 0;
    OffsetInfo_1.Render.ZOffset = 0;
    OffsetInfo_1.Render._20_4_ = 0;
    OffsetInfo_1.Lock.Pitch = 0;
    OffsetInfo_1.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo_1.Render.field_0.Offset = 0;
    OffsetInfo_1.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
    OffsetInfo_1._28_4_ = 0;
    OffsetInfo_1.Lock.field_0.Offset = 0;
    OffsetInfo_1.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.MipLevel = 0;
    OffsetInfo_1.Slice = 0;
    OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo_1.Plane = GMM_NO_PLANE;
    gtest_ar_24.message_.ptr_._4_4_ = 0;
    OffsetInfo_1.ArrayIndex = 0;
    gtest_ar_24.message_.ptr_._0_4_ = 1;
    OffsetInfo_1._0_4_ = 1;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar_24.message_);
    local_8fc = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_8f8,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_8fc
               ,&OffsetInfo_1.Lock.Pitch);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
    if (!bVar1) {
      testing::Message::Message(&local_908);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x490,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_908);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
      testing::Message::~Message(&local_908);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
    local_924 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_920,"0",(int *)"OffsetInfo.Render.XOffset",&local_924,
               &OffsetInfo_1.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
    if (!bVar1) {
      testing::Message::Message(&local_930);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x491,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_930);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
      testing::Message::~Message(&local_930);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
    local_94c = iVar5 + 1U & -iVar5;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_948,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",&local_94c,
               (uint *)((long)&OffsetInfo_1.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_948);
    if (!bVar1) {
      testing::Message::Message(&local_958);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_948);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x492,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
      testing::Message::~Message(&local_958);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_948);
    local_974 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_970,"0",(int *)"OffsetInfo.Render.ZOffset",&local_974,
               &OffsetInfo_1.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
    if (!bVar1) {
      testing::Message::Message(&local_980);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
      testing::internal::AssertHelper::AssertHelper
                (&local_988,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x493,pcVar7);
      testing::internal::AssertHelper::operator=(&local_988,&local_980);
      testing::internal::AssertHelper::~AssertHelper(&local_988);
      testing::Message::~Message(&local_980);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
    gtest_ar_32.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OffsetInfo_1.StdLayout.Offset = 0;
    OffsetInfo_1.StdLayout.TileRowPitch = 0;
    OffsetInfo_1.Render.XOffset = 0;
    OffsetInfo_1.Render.YOffset = 0;
    OffsetInfo_1.Render.ZOffset = 0;
    OffsetInfo_1.Render._20_4_ = 0;
    OffsetInfo_1.Lock.Pitch = 0;
    OffsetInfo_1.Lock.field_2.Mip0SlicePitch = 0;
    OffsetInfo_1.Render.field_0.Offset = 0;
    OffsetInfo_1.Render.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
    OffsetInfo_1._28_4_ = 0;
    OffsetInfo_1.Lock.field_0.Offset = 0;
    OffsetInfo_1.Lock.field_0.Offset64._4_4_ = 0;
    OffsetInfo_1.MipLevel = 0;
    OffsetInfo_1.Slice = 0;
    OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo_1.Plane = GMM_NO_PLANE;
    gtest_ar_24.message_.ptr_._4_4_ = 0;
    OffsetInfo_1.ArrayIndex = 0;
    gtest_ar_24.message_.ptr_._0_4_ = 1;
    OffsetInfo_1._0_4_ = 2;
    (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar_24.message_);
    local_9fc = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_9f8,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_9fc
               ,&OffsetInfo_1.Lock.Pitch);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
    if (!bVar1) {
      testing::Message::Message(&local_a08);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_9f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff5f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49a,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff5f0,&local_a08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff5f0);
      testing::Message::~Message(&local_a08);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
    uVar3 = CTestResource::GetBppValue
                      (&this->super_CTestResource,gmmParams_1.MultiTileArch.Reserved);
    gtest_ar_33.message_.ptr_._4_4_ = (uVar4 + 1 & -uVar4) * uVar3;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_a28,"Mip1Width","OffsetInfo.Render.XOffset",
               (uint *)((long)&gtest_ar_33.message_.ptr_ + 4),(uint *)&OffsetInfo_1.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
    if (!bVar1) {
      testing::Message::Message(&local_a30);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49c,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_a30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
      testing::Message::~Message(&local_a30);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
    local_a4c = iVar5 + 1U & -iVar5;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_a48,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",&local_a4c,
               (uint *)((long)&OffsetInfo_1.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
    if (!bVar1) {
      testing::Message::Message(&local_a58);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_a58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
      testing::Message::~Message(&local_a58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
    local_a74 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_a70,"0",(int *)"OffsetInfo.Render.ZOffset",&local_a74,
               &OffsetInfo_1.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
    if (!bVar1) {
      testing::Message::Message(&local_a80);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
      testing::internal::AssertHelper::AssertHelper
                (&local_a88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_a88,&local_a80);
      testing::internal::AssertHelper::~AssertHelper(&local_a88);
      testing::Message::~Message(&local_a80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
    CTestResource::VerifyResourceSize<true>(&this->super_CTestResource,pGVar6,0x1000);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar6,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this->super_CTestResource,pGVar6,ExpectedValue / 0x80);
    CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,pGVar6,0);
    CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,pGVar6,0);
    CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,pGVar6,0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
  }
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceMips)
{
    const uint32_t TileSize[2] = {128, 32};
    enum Coords
    {
        X = 0,
        Y = 1
    };

    // Test normal mip case
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        const uint32_t ResourceWidth  = 0x200;
        const uint32_t ResourceHeight = 0x200;
        const uint32_t MaxLod         = 0x9;


        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Mip0 is the widest mip. So it will dictate the pitch of the whole surface
        const uint32_t Pitch            = ResourceWidth * GetBppValue(bpp);
        uint32_t       AllocationHeight = 0;

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        uint32_t SizeOfMip0      = Pitch * ResourceHeight;
        uint32_t HeightOfPrevMip = AllocationHeight = ResourceHeight;
        EXPECT_EQ(SizeOfMip0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        // MipOffset = Mip1Offset + Mip1Width in tiles
        uint32_t MipOffset = SizeOfMip0 + ((Pitch >> 1) / TileSize[X]) * PAGE_SIZE;
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mips 3-5 should be on tile boundary
        for(int i = 3; i < 6; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            HeightOfPrevMip = (ResourceHeight >> (i - 1));
            AllocationHeight += HeightOfPrevMip;
            MipOffset += Pitch * HeightOfPrevMip;
            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
            // No X/Y/Z offset since mip is at tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mips 6-8 will share 1 tile
        AllocationHeight += TileSize[Y];
        uint32_t HeightOfPrevMipsInTile = 0;
        for(int i = 6; i < 9; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64); // Same as previous tile aligned mip offset

            // X is 0, but Y offset will change
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            HeightOfPrevMipsInTile += (ResourceHeight >> (i - 1));
            EXPECT_EQ(HeightOfPrevMipsInTile, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mip 9 is back on tile boundary
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 9; // Mip 9
        ResourceInfo->GetOffset(OffsetInfo);

        MipOffset += Pitch * TileSize[Y];
        AllocationHeight += TileSize[Y];
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, AllocationHeight * Pitch);
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }


    // Test where Mip1 + Mip2 width > Mip0 width, and where everything fits in 1 tile
    for(uint32_t i = 0; i < TEST_BPP_64; i++)
    {
        const uint32_t ResourceWidth  = 0x4;
        const uint32_t ResourceHeight = 0x2;
        const uint32_t MaxLod         = 0x2;

        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Get Alignment that GmmLib is using
        const uint32_t HAlign = ResourceInfo->GetHAlign();
        const uint32_t VAlign = ResourceInfo->GetVAlign();

        // Mip1 + Mip2 is the widest width. So it will dictate the pitch of the whole surface
        uint32_t Pitch = GetBppValue(bpp) *
                         (GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) + GMM_ULT_ALIGN(ResourceWidth >> 2, HAlign));
        Pitch = GMM_ULT_ALIGN(Pitch, TileSize[X]);

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same tile as Mip0
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same Tile as Mip0
        uint32_t Mip1Width = GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) * GetBppValue(bpp);
        EXPECT_EQ(Mip1Width, OffsetInfo.Render.XOffset);                             // On right of Mip1
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, PAGE_SIZE); // everything should fit in 1 tile
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}